

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_ManVectorAffinity(Gia_Man_t *p,Vec_Int_t *vSuper,Vec_Int_t *vDelay,word *Matrix,int nLimit)

{
  ulong uVar1;
  uint nSizeNew_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  int local_494;
  Gia_Obj_t *pObj;
  word Mask;
  int nSizeNew;
  int iFanin;
  int iLit;
  int k;
  int i;
  int nLevels;
  int Prev;
  int nSize;
  int Levels [256];
  int fVerbose;
  int nLimit_local;
  word *Matrix_local;
  Vec_Int_t *vDelay_local;
  Vec_Int_t *vSuper_local;
  Gia_Man_t *p_local;
  
  Levels[0xfe] = 0;
  Levels[0xff] = nLimit;
  nSizeNew_00 = Vec_IntSize(vSuper);
  k = 1;
  if ((int)nSizeNew_00 < 3) {
    __assert_fail("nSize > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                  ,0x366,
                  "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)");
  }
  if ((int)nSizeNew_00 < 0x41) {
    Gia_ManIncrementTravId(p);
    for (iLit = 0; iVar2 = Vec_IntSize(vSuper), iLit < iVar2; iLit = iLit + 1) {
      iVar2 = Vec_IntEntry(vSuper,iLit);
      iVar3 = Abc_Lit2Var(iVar2);
      Gia_ObjSetTravIdCurrentId(p,iVar3);
      iVar2 = Abc_Lit2Var(iVar2);
      Str_ManSetNum(p,iVar2,iLit);
      Matrix[iLit] = 1L << (0x3fU - (char)iLit & 0x3f);
      (&Prev)[iLit] = 0;
    }
    i = nSizeNew_00;
    for (iLit = 0; iVar2 = Vec_IntSize(vSuper), iLit < iVar2; iLit = iLit + 1) {
      iVar2 = Vec_IntEntry(vSuper,iLit);
      iVar2 = Abc_Lit2Var(iVar2);
      pObj_00 = Gia_ManObj(p,iVar2);
      iVar2 = Gia_ObjIsAnd(pObj_00);
      if (iVar2 != 0) {
        for (iFanin = 0; iFanin < 2; iFanin = iFanin + 1) {
          if (iFanin == 0) {
            local_494 = Gia_ObjFaninId0p(p,pObj_00);
          }
          else {
            local_494 = Gia_ObjFaninId1p(p,pObj_00);
          }
          iVar2 = Gia_ObjIsTravIdCurrentId(p,local_494);
          if (iVar2 == 0) {
            iVar2 = Vec_IntSize(vSuper);
            if (iVar2 == Levels[0xff]) break;
            Gia_ObjSetTravIdCurrentId(p,local_494);
            iVar2 = Vec_IntSize(vSuper);
            Matrix[iVar2] = 0;
            iVar2 = Vec_IntSize(vSuper);
            (&Prev)[iVar2] = k;
            iVar2 = Vec_IntSize(vSuper);
            Str_ManSetNum(p,local_494,iVar2);
            iVar2 = Abc_Var2Lit(local_494,0);
            Vec_IntPush(vSuper,iVar2);
          }
          uVar1 = Matrix[iLit];
          iVar2 = Str_ManNum(p,local_494);
          Matrix[iVar2] = uVar1 | Matrix[iVar2];
        }
      }
      iVar2 = Gia_ObjIsMux(p,pObj_00);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjFaninId2p(p,pObj_00);
        iVar3 = Gia_ObjIsTravIdCurrentId(p,iVar2);
        if (iVar3 == 0) {
          iVar3 = Vec_IntSize(vSuper);
          if (iVar3 == Levels[0xff]) break;
          Gia_ObjSetTravIdCurrentId(p,iVar2);
          iVar3 = Vec_IntSize(vSuper);
          Matrix[iVar3] = 0;
          iVar3 = Vec_IntSize(vSuper);
          (&Prev)[iVar3] = k;
          iVar3 = Vec_IntSize(vSuper);
          Str_ManSetNum(p,iVar2,iVar3);
          iVar3 = Abc_Var2Lit(iVar2,0);
          Vec_IntPush(vSuper,iVar3);
        }
        uVar1 = Matrix[iLit];
        iVar2 = Str_ManNum(p,iVar2);
        Matrix[iVar2] = uVar1 | Matrix[iVar2];
      }
      if (i == iLit) {
        i = Vec_IntSize(vSuper);
        k = k + 1;
      }
      if (k == 8) break;
    }
    iFanin = 0;
    for (iLit = 0; iVar2 = Vec_IntSize(vSuper), iLit < iVar2; iLit = iLit + 1) {
      if (Matrix[iLit] == 0) {
        __assert_fail("Matrix[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                      ,0x3a5,
                      "int Str_ManVectorAffinity(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, word *, int)"
                     );
      }
      if (((Matrix[iLit] & Matrix[iLit] - 1) != 0) &&
         (Matrix[iLit] != -1L << (0x40U - (char)nSizeNew_00 & 0x3f))) {
        Matrix[iFanin] = Matrix[iLit];
        (&Prev)[iFanin] = (&Prev)[iLit];
        iFanin = iFanin + 1;
        if (iFanin == 0x40) break;
      }
    }
    for (iLit = iFanin; iLit < 0x40; iLit = iLit + 1) {
      Matrix[iLit] = 0;
    }
    if (iFanin == 0) {
      Vec_IntShrink(vSuper,nSizeNew_00);
      p_local._4_4_ = 0;
    }
    else {
      transpose64(Matrix);
      if ((Levels[0xfe] != 0) && (10 < (int)nSizeNew_00)) {
        iVar2 = Vec_IntSize(vSuper);
        uVar4 = Vec_IntSize(vSuper);
        printf("Gate inputs = %d.  Collected fanins = %d.  All = %d.  Good = %d.  Levels = %d\n",
               (ulong)nSizeNew_00,(ulong)(iVar2 - nSizeNew_00),(ulong)uVar4,(ulong)(uint)iFanin,
               (ulong)(uint)k);
        printf("                     ");
        for (iLit = 0; iLit < iFanin; iLit = iLit + 1) {
          printf("%d",(ulong)(uint)(&Prev)[iLit]);
        }
        printf("\n");
        for (iLit = 0; iLit < (int)nSizeNew_00; iLit = iLit + 1) {
          iVar2 = Vec_IntEntry(vSuper,iLit);
          uVar4 = Abc_Lit2Var(iVar2);
          printf("%6d : ",(ulong)uVar4);
          iVar2 = Vec_IntEntry(vDelay,iLit);
          printf("%3d   ",(ulong)(uint)(iVar2 >> 4));
          uVar4 = Vec_IntEntry(vDelay,iLit);
          printf("%3d   ",(ulong)(uVar4 & 0xf));
        }
      }
      Vec_IntShrink(vSuper,nSizeNew_00);
      p_local._4_4_ = iFanin;
    }
  }
  else {
    for (iLit = 0; iLit < 0x40; iLit = iLit + 1) {
      Matrix[iLit] = 0;
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Str_ManVectorAffinity( Gia_Man_t * p, Vec_Int_t * vSuper, Vec_Int_t * vDelay, word Matrix[256], int nLimit )
{
    int fVerbose = 0;
    int Levels[256];
    int nSize = Vec_IntSize(vSuper);
    int Prev = nSize, nLevels = 1;
    int i, k, iLit, iFanin, nSizeNew;
    word Mask; 
    assert( nSize > 2 );
    if ( nSize > 64 )
    {
        for ( i = 0; i < 64; i++ )
            Matrix[i] = 0;
        return 0;
    }
    // mark current nodes
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_ObjSetTravIdCurrentId( p, Abc_Lit2Var(iLit) );
        Str_ManSetNum( p, Abc_Lit2Var(iLit), i );
        Matrix[i] = ((word)1) << (63-i);
        Levels[i] = 0;
    }
    // collect 64 nodes
    Vec_IntForEachEntry( vSuper, iLit, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            for ( k = 0; k < 2; k++ )
            {
                iFanin = k ? Gia_ObjFaninId1p(p, pObj) : Gia_ObjFaninId0p(p, pObj);
                if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
                {
                    if ( Vec_IntSize(vSuper) == nLimit )
                        break;
                    Gia_ObjSetTravIdCurrentId( p, iFanin );
                    Matrix[Vec_IntSize(vSuper)] = 0;
                    Levels[Vec_IntSize(vSuper)] = nLevels;
                    Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                    Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
                }
                Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
            }
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {
            iFanin = Gia_ObjFaninId2p(p, pObj);
            if ( !Gia_ObjIsTravIdCurrentId(p, iFanin) )
            {
                if ( Vec_IntSize(vSuper) == nLimit )
                    break;
                Gia_ObjSetTravIdCurrentId( p, iFanin );
                Matrix[Vec_IntSize(vSuper)] = 0;
                Levels[Vec_IntSize(vSuper)] = nLevels;
                Str_ManSetNum( p, iFanin, Vec_IntSize(vSuper) );
                Vec_IntPush( vSuper, Abc_Var2Lit(iFanin, 0) );
            }
            Matrix[Str_ManNum(p, iFanin)] |= Matrix[i];
        }
        if ( Prev == i )
            Prev = Vec_IntSize(vSuper), nLevels++;
        if ( nLevels == 8 )
            break;
    }

    // remove those that have all 1s or only one 1
    Mask = (~(word)0) << (64 - nSize);
    for ( k = i = 0; i < Vec_IntSize(vSuper); i++ )
    {
        assert( Matrix[i] );
        if ( (Matrix[i] & (Matrix[i] - 1)) == 0 )
            continue;
        if ( Matrix[i] == Mask )
            continue;
        Matrix[k] = Matrix[i];
        Levels[k] = Levels[i];
        k++;
        if ( k == 64 )
            break;
    }
    // clean the remaining ones
    for ( i = k; i < 64; i++ )
        Matrix[i] = 0;
    nSizeNew = k;
    if ( nSizeNew == 0 )
    {
        Vec_IntShrink( vSuper, nSize );
        return 0;
    }
/*
    // report
    if ( fVerbose && nSize > 20 )
    {
        for ( i = 0; i < nSizeNew; i++ )
            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        printf( "\n" );
    }
*/
    transpose64( Matrix );

    // report
    if ( fVerbose && nSize > 10 )
    {
        printf( "Gate inputs = %d.  Collected fanins = %d.  All = %d.  Good = %d.  Levels = %d\n", 
            nSize, Vec_IntSize(vSuper) - nSize, Vec_IntSize(vSuper), nSizeNew, nLevels );
        printf( "                     " );
        for ( i = 0; i < nSizeNew; i++ )
            printf( "%d", Levels[i] );
        printf( "\n" );
        for ( i = 0; i < nSize; i++ )
        {
            printf( "%6d : ", Abc_Lit2Var(Vec_IntEntry(vSuper, i)) );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) >> 4 );
            printf( "%3d   ", Vec_IntEntry(vDelay, i) & 15 );
//            Extra_PrintBinary( stdout, Matrix+i, 64 ), printf( "\n" );
        }
        i = 0;
    }
    Vec_IntShrink( vSuper, nSize );
    return nSizeNew;
}